

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
  *this_00;
  ParseInfoTree *this_01;
  reference this_02;
  pointer pPVar1;
  ParseInfoTree *local_28;
  vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
  *local_20;
  vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>
  *vec;
  FieldDescriptor *field_local;
  ParseInfoTree *this_local;
  
  vec = (vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>
         *)field;
  field_local = (FieldDescriptor *)this;
  this_00 = (vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
             *)absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
               ::
               operator[]<google::protobuf::FieldDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
                           *)&this->nested_,
                          (key_arg<const_google::protobuf::FieldDescriptor_*> *)&vec);
  local_20 = this_00;
  this_01 = (ParseInfoTree *)operator_new(0x40);
  (((HeapOrSoo *)
   ((long)&(this_01->nested_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   0x10))->heap).control = (ctrl_t *)0x0;
  *(undefined8 *)
   ((long)&(this_01->nested_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   0x18) = 0;
  (this_01->nested_).
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  *(size_t *)
   ((long)&(this_01->nested_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   8) = 0;
  (((HeapOrSoo *)
   ((long)&(this_01->locations_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   0x10))->heap).control = (ctrl_t *)0x0;
  *(undefined8 *)
   ((long)&(this_01->locations_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   0x18) = 0;
  (this_01->locations_).
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  *(size_t *)
   ((long)&(this_01->locations_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   8) = 0;
  ParseInfoTree(this_01);
  local_28 = this_01;
  std::
  vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
  ::emplace_back<google::protobuf::TextFormat::ParseInfoTree*>(this_00,&local_28);
  this_02 = std::
            vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>
            ::back((vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>
                    *)local_20);
  pPVar1 = std::
           unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
           ::get(this_02);
  return pPVar1;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  auto& vec = nested_[field];
  vec.emplace_back(new TextFormat::ParseInfoTree());
  return vec.back().get();
}